

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O2

void __thiscall CompilerStatistics::Add(CompilerStatistics *this,CompilerStatistics *other)

{
  uint uVar1;
  Timer *pTVar2;
  uint i;
  uint index;
  
  for (index = 0; index < (this->timers).count; index = index + 1) {
    pTVar2 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&other->timers,index);
    uVar1 = pTVar2->total;
    pTVar2 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&this->timers,index);
    pTVar2->total = pTVar2->total + uVar1;
  }
  this->finishTime = 0;
  return;
}

Assistant:

void Add(CompilerStatistics& other)
	{
		for(unsigned i = 0; i < timers.size(); i++)
			timers[i].total += other.timers[i].total;

		finishTime = 0;
	}